

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

void __thiscall
Js::ParseableFunctionInfo::ParseableFunctionInfo
          (ParseableFunctionInfo *this,ParseableFunctionInfo *proxy)

{
  bool bVar1;
  ArgSlot AVar2;
  uint functionNumber;
  uint uVar3;
  uint uVar4;
  ScriptContext *scriptContext;
  Utf8SourceInfo *utf8SourceInfo;
  Recycler *pRVar5;
  NestedArray *this_00;
  undefined8 uVar6;
  nullptr_t local_68;
  code *local_60;
  undefined8 local_58;
  TrackAllocData local_50;
  uint local_24;
  FunctionInfo *pFStack_20;
  uint nestedCount;
  FunctionInfo *functionInfo;
  ParseableFunctionInfo *proxy_local;
  ParseableFunctionInfo *this_local;
  
  functionInfo = (FunctionInfo *)proxy;
  proxy_local = this;
  scriptContext = FunctionProxy::GetScriptContext(&proxy->super_FunctionProxy);
  utf8SourceInfo = FunctionProxy::GetUtf8SourceInfo((FunctionProxy *)functionInfo);
  functionNumber = FunctionProxy::GetFunctionNumber((FunctionProxy *)functionInfo);
  FunctionProxy::FunctionProxy
            (&this->super_FunctionProxy,scriptContext,utf8SourceInfo,functionNumber);
  (this->super_FunctionProxy).super_FinalizableObject.super_IRecyclerVisitedObject.
  _vptr_IRecyclerVisitedObject = (_func_int **)&PTR_Finalize_01de0678;
  *(ushort *)&(this->super_FunctionProxy).field_0x45 =
       *(ushort *)&(this->super_FunctionProxy).field_0x45 & 0xfffe | 1;
  *(ushort *)&(this->super_FunctionProxy).field_0x45 =
       *(ushort *)&(this->super_FunctionProxy).field_0x45 & 0xfffd;
  bVar1 = GetIsStaticNameFunction((ParseableFunctionInfo *)functionInfo);
  *(ushort *)&(this->super_FunctionProxy).field_0x45 =
       *(ushort *)&(this->super_FunctionProxy).field_0x45 & 0xffef | (ushort)bVar1 << 4;
  bVar1 = GetIsNamedFunctionExpression((ParseableFunctionInfo *)functionInfo);
  *(ushort *)&(this->super_FunctionProxy).field_0x45 =
       *(ushort *)&(this->super_FunctionProxy).field_0x45 & 0xffdf | (ushort)bVar1 << 5;
  bVar1 = GetIsNameIdentifierRef((ParseableFunctionInfo *)functionInfo);
  *(ushort *)&(this->super_FunctionProxy).field_0x45 =
       *(ushort *)&(this->super_FunctionProxy).field_0x45 & 0xffbf | (ushort)bVar1 << 6;
  bVar1 = IsReparsed((ParseableFunctionInfo *)functionInfo);
  (this->super_FunctionProxy).field_0x47 =
       (this->super_FunctionProxy).field_0x47 & 0xef | bVar1 << 4;
  bVar1 = IsMethod((ParseableFunctionInfo *)functionInfo);
  (this->super_FunctionProxy).field_0x47 =
       (this->super_FunctionProxy).field_0x47 & 0xdf | bVar1 << 5;
  (this->super_FunctionProxy).field_0x47 =
       (this->super_FunctionProxy).field_0x47 & 0xbf |
       (*(byte *)((long)&functionInfo[2].originalEntryPoint + 7) >> 6 & 1) << 6;
  AVar2 = GetReportedInParamsCount((ParseableFunctionInfo *)functionInfo);
  this->m_reportedInParamCount = AVar2;
  this->m_dynamicInterpreterThunk = (Type)0x0;
  Memory::WriteBarrierPtr<Js::ScriptFunctionType>::WriteBarrierPtr
            (&this->crossSiteDeferredFunctionType);
  Memory::WriteBarrierPtr<Js::ScriptFunctionType>::WriteBarrierPtr
            (&this->crossSiteUndeferredFunctionType);
  Memory::WriteBarrierPtr<const_char16_t>::WriteBarrierPtr(&this->m_displayName);
  Memory::WriteBarrierPtr<Js::ParseableFunctionInfo::NestedArray>::WriteBarrierPtr
            (&this->nestedArray);
  pFStack_20 = FunctionProxy::GetFunctionInfo((FunctionProxy *)functionInfo);
  Memory::WriteBarrierPtr<Js::FunctionInfo>::operator=
            (&(this->super_FunctionProxy).functionInfo,pFStack_20);
  local_24 = GetNestedCount((ParseableFunctionInfo *)functionInfo);
  if (local_24 == 0) {
    local_68 = (nullptr_t)0x0;
    Memory::WriteBarrierPtr<Js::ParseableFunctionInfo::NestedArray>::operator=
              (&this->nestedArray,&local_68);
  }
  else {
    pRVar5 = ScriptContext::GetRecycler((this->super_FunctionProxy).m_scriptContext);
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_50,(type_info *)&NestedArray::typeinfo,(ulong)local_24 << 3,0xffffffffffffffff
               ,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
               ,0x6c2);
    pRVar5 = Memory::Recycler::TrackAllocInfo(pRVar5,&local_50);
    local_60 = Memory::Recycler::AllocZero;
    local_58 = 0;
    this_00 = (NestedArray *)new<Memory::Recycler>(8,pRVar5,0x473830,0);
    NestedArray::NestedArray(this_00,local_24);
    Memory::WriteBarrierPtr<Js::ParseableFunctionInfo::NestedArray>::operator=
              (&this->nestedArray,this_00);
  }
  Copy((ParseableFunctionInfo *)functionInfo,this);
  uVar6 = (**(code **)(functionInfo->originalEntryPoint + 0x38))();
  uVar3 = (**(code **)(functionInfo->originalEntryPoint + 0x40))();
  uVar4 = (**(code **)(functionInfo->originalEntryPoint + 0x48))();
  (*(this->super_FunctionProxy).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[6])(this,uVar6,(ulong)uVar3,(ulong)uVar4,0);
  return;
}

Assistant:

ParseableFunctionInfo::ParseableFunctionInfo(ParseableFunctionInfo * proxy) :
      FunctionProxy(proxy->GetScriptContext(), proxy->GetUtf8SourceInfo(), proxy->GetFunctionNumber()),
#if DYNAMIC_INTERPRETER_THUNK
      m_dynamicInterpreterThunk(nullptr),
#endif
      m_hasBeenParsed(false),
      m_isNamedFunctionExpression(proxy->GetIsNamedFunctionExpression()),
      m_isNameIdentifierRef (proxy->GetIsNameIdentifierRef()),
      m_isStaticNameFunction(proxy->GetIsStaticNameFunction()),
      m_reportedInParamCount(proxy->GetReportedInParamsCount()),
      m_reparsed(proxy->IsReparsed()),
      m_isMethod(proxy->IsMethod()),
      m_tag21(true)
#if DBG
      , m_wasEverAsmjsMode(proxy->m_wasEverAsmjsMode)
#endif
    {
        FunctionInfo * functionInfo = proxy->GetFunctionInfo();
        this->functionInfo = functionInfo;

        uint nestedCount = proxy->GetNestedCount();
        if (nestedCount > 0)
        {
            nestedArray = RecyclerNewPlusZ(m_scriptContext->GetRecycler(),
                nestedCount*sizeof(FunctionProxy*), NestedArray, nestedCount);
        }
        else
        {
            nestedArray = nullptr;
        }

        proxy->Copy(this);

        SetDisplayName(proxy->GetDisplayName(), proxy->GetDisplayNameLength(), proxy->GetShortDisplayNameOffset());
    }